

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_decoding.h
# Opt level: O0

bool draco::DecodeVarint<unsigned_long>(unsigned_long *out_val,DecoderBuffer *buffer)

{
  bool bVar1;
  DecoderBuffer *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = anon_unknown_2::DecodeVarintUnsigned<unsigned_long>
                    ((int)buffer,
                     (unsigned_long *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     in_RDI);
  return bVar1;
}

Assistant:

bool DecodeVarint(IntTypeT *out_val, DecoderBuffer *buffer) {
  if (std::is_unsigned<IntTypeT>::value) {
    if (!DecodeVarintUnsigned<IntTypeT>(1, out_val, buffer)) {
      return false;
    }
  } else {
    // IntTypeT is a signed value. Decode the symbol and convert to signed.
    typename std::make_unsigned<IntTypeT>::type symbol;
    if (!DecodeVarintUnsigned(1, &symbol, buffer)) {
      return false;
    }
    *out_val = ConvertSymbolToSignedInt(symbol);
  }
  return true;
}